

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O3

Matrix4x4 * __thiscall CMU462::Matrix4x4::inv(Matrix4x4 *__return_storage_ptr__,Matrix4x4 *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  int i;
  long lVar16;
  double *pdVar17;
  long lVar18;
  Matrix4x4 *A;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  
  dVar21 = this->entries[1].x;
  dVar24 = -dVar21;
  dVar1 = this->entries[0].y;
  dVar2 = this->entries[0].z;
  dVar25 = -dVar1;
  dVar10 = this->entries[3].y;
  dVar11 = this->entries[3].z;
  dVar12 = this->entries[2].y;
  dVar13 = this->entries[2].z;
  dVar14 = this->entries[1].y;
  dVar15 = this->entries[1].z;
  dVar19 = -dVar14;
  dVar3 = this->entries[0].x;
  dVar23 = -dVar3;
  dVar4 = this->entries[3].x;
  dVar5 = this->entries[2].x;
  dVar20 = -dVar5;
  dVar22 = -dVar4;
  dVar6 = this->entries[2].w;
  dVar7 = this->entries[3].w;
  dVar8 = this->entries[0].w;
  dVar9 = this->entries[1].w;
  __return_storage_ptr__->entries[1].x =
       dVar13 * dVar24 * dVar7 +
       dVar5 * dVar15 * dVar7 +
       dVar11 * dVar21 * dVar6 +
       dVar15 * dVar22 * dVar6 + (dVar13 * dVar4 * dVar9 - dVar9 * dVar11 * dVar5);
  __return_storage_ptr__->entries[1].y =
       dVar13 * dVar3 * dVar7 +
       dVar2 * dVar20 * dVar7 +
       dVar11 * dVar23 * dVar6 +
       dVar4 * dVar2 * dVar6 + (dVar11 * dVar5 * dVar8 - dVar8 * dVar13 * dVar4);
  __return_storage_ptr__->entries[2].x =
       dVar12 * dVar21 * dVar7 +
       dVar20 * dVar14 * dVar7 +
       dVar10 * dVar24 * dVar6 +
       dVar14 * dVar4 * dVar6 + dVar9 * dVar5 * dVar10 + dVar12 * dVar22 * dVar9;
  __return_storage_ptr__->entries[2].y =
       dVar12 * dVar23 * dVar7 +
       dVar1 * dVar5 * dVar7 +
       dVar10 * dVar3 * dVar6 +
       dVar22 * dVar1 * dVar6 + dVar8 * dVar4 * dVar12 + dVar10 * dVar20 * dVar8;
  __return_storage_ptr__->entries[0].x =
       dVar14 * dVar13 * dVar7 +
       dVar15 * -dVar12 * dVar7 +
       dVar19 * dVar11 * dVar6 +
       dVar15 * dVar10 * dVar6 + (dVar11 * dVar12 * dVar9 - dVar13 * dVar10 * dVar9);
  __return_storage_ptr__->entries[0].y =
       dVar25 * dVar13 * dVar7 +
       dVar12 * dVar2 * dVar7 +
       dVar1 * dVar11 * dVar6 +
       -dVar10 * dVar2 * dVar6 + (dVar10 * dVar13 * dVar8 - dVar11 * dVar12 * dVar8);
  __return_storage_ptr__->entries[0].z =
       dVar1 * dVar15 * dVar7 +
       dVar19 * dVar2 * dVar7 +
       dVar11 * dVar25 * dVar9 +
       dVar10 * dVar2 * dVar9 + dVar11 * dVar14 * dVar8 + -dVar10 * dVar15 * dVar8;
  __return_storage_ptr__->entries[0].w =
       dVar25 * dVar15 * dVar6 +
       dVar2 * dVar14 * dVar6 +
       dVar13 * dVar1 * dVar9 +
       -dVar12 * dVar2 * dVar9 + dVar12 * dVar15 * dVar8 + dVar13 * dVar19 * dVar8;
  __return_storage_ptr__->entries[1].z =
       dVar15 * dVar23 * dVar7 +
       dVar2 * dVar21 * dVar7 +
       dVar11 * dVar3 * dVar9 +
       dVar2 * dVar22 * dVar9 + dVar4 * dVar15 * dVar8 + dVar24 * dVar11 * dVar8;
  __return_storage_ptr__->entries[1].w =
       dVar15 * dVar3 * dVar6 +
       dVar24 * dVar2 * dVar6 +
       dVar13 * dVar23 * dVar9 +
       dVar5 * dVar2 * dVar9 + dVar21 * dVar13 * dVar8 + dVar20 * dVar15 * dVar8;
  __return_storage_ptr__->entries[3].x =
       dVar24 * dVar12 * dVar11 +
       dVar5 * dVar14 * dVar11 +
       dVar21 * dVar10 * dVar13 +
       dVar22 * dVar14 * dVar13 + dVar15 * dVar4 * dVar12 + dVar10 * dVar20 * dVar15;
  __return_storage_ptr__->entries[3].y =
       dVar3 * dVar12 * dVar11 +
       dVar20 * dVar1 * dVar11 +
       dVar23 * dVar10 * dVar13 +
       dVar1 * dVar4 * dVar13 + dVar2 * dVar5 * dVar10 + dVar12 * dVar22 * dVar2;
  __return_storage_ptr__->entries[2].z =
       dVar7 * dVar14 * dVar3 +
       dVar24 * dVar1 * dVar7 +
       dVar23 * dVar10 * dVar9 +
       dVar1 * dVar4 * dVar9 + dVar21 * dVar10 * dVar8 + dVar22 * dVar14 * dVar8;
  __return_storage_ptr__->entries[2].w =
       dVar6 * dVar14 * dVar23 +
       dVar1 * dVar21 * dVar6 +
       dVar3 * dVar12 * dVar9 +
       dVar20 * dVar1 * dVar9 + dVar5 * dVar14 * dVar8 + dVar24 * dVar12 * dVar8;
  __return_storage_ptr__->entries[3].z =
       dVar14 * dVar23 * dVar11 +
       dVar1 * dVar21 * dVar11 +
       dVar10 * dVar3 * dVar15 +
       dVar22 * dVar1 * dVar15 + dVar14 * dVar4 * dVar2 + dVar10 * dVar24 * dVar2;
  __return_storage_ptr__->entries[3].w =
       dVar14 * dVar3 * dVar13 +
       dVar24 * dVar1 * dVar13 +
       dVar12 * dVar23 * dVar15 +
       dVar1 * dVar5 * dVar15 + dVar12 * dVar21 * dVar2 + dVar20 * dVar14 * dVar2;
  dVar21 = det(this);
  lVar16 = 0;
  pdVar17 = (double *)__return_storage_ptr__;
  do {
    lVar18 = 0;
    do {
      *(double *)((long)pdVar17 + lVar18) = *(double *)((long)pdVar17 + lVar18) * (1.0 / dVar21);
      lVar18 = lVar18 + 0x20;
    } while (lVar18 != 0x80);
    lVar16 = lVar16 + 1;
    pdVar17 = pdVar17 + 1;
  } while (lVar16 != 4);
  return __return_storage_ptr__;
}

Assistant:

Matrix4x4 Matrix4x4::inv( void ) const {
    const Matrix4x4& A( *this );
    Matrix4x4 B;

	// Hardcoded in Fully Symbolic computation.

	B(0,0) = A(1,2)*A(2,3)*A(3,1) - A(1,3)*A(2,2)*A(3,1) + A(1,3)*A(2,1)*A(3,2) - A(1,1)*A(2,3)*A(3,2) - A(1,2)*A(2,1)*A(3,3) + A(1,1)*A(2,2)*A(3,3);
	B(0,1) = A(0,3)*A(2,2)*A(3,1) - A(0,2)*A(2,3)*A(3,1) - A(0,3)*A(2,1)*A(3,2) + A(0,1)*A(2,3)*A(3,2) + A(0,2)*A(2,1)*A(3,3) - A(0,1)*A(2,2)*A(3,3);
	B(0,2) = A(0,2)*A(1,3)*A(3,1) - A(0,3)*A(1,2)*A(3,1) + A(0,3)*A(1,1)*A(3,2) - A(0,1)*A(1,3)*A(3,2) - A(0,2)*A(1,1)*A(3,3) + A(0,1)*A(1,2)*A(3,3);
	B(0,3) = A(0,3)*A(1,2)*A(2,1) - A(0,2)*A(1,3)*A(2,1) - A(0,3)*A(1,1)*A(2,2) + A(0,1)*A(1,3)*A(2,2) + A(0,2)*A(1,1)*A(2,3) - A(0,1)*A(1,2)*A(2,3);
	B(1,0) = A(1,3)*A(2,2)*A(3,0) - A(1,2)*A(2,3)*A(3,0) - A(1,3)*A(2,0)*A(3,2) + A(1,0)*A(2,3)*A(3,2) + A(1,2)*A(2,0)*A(3,3) - A(1,0)*A(2,2)*A(3,3);
	B(1,1) = A(0,2)*A(2,3)*A(3,0) - A(0,3)*A(2,2)*A(3,0) + A(0,3)*A(2,0)*A(3,2) - A(0,0)*A(2,3)*A(3,2) - A(0,2)*A(2,0)*A(3,3) + A(0,0)*A(2,2)*A(3,3);
	B(1,2) = A(0,3)*A(1,2)*A(3,0) - A(0,2)*A(1,3)*A(3,0) - A(0,3)*A(1,0)*A(3,2) + A(0,0)*A(1,3)*A(3,2) + A(0,2)*A(1,0)*A(3,3) - A(0,0)*A(1,2)*A(3,3);
	B(1,3) = A(0,2)*A(1,3)*A(2,0) - A(0,3)*A(1,2)*A(2,0) + A(0,3)*A(1,0)*A(2,2) - A(0,0)*A(1,3)*A(2,2) - A(0,2)*A(1,0)*A(2,3) + A(0,0)*A(1,2)*A(2,3);
	B(2,0) = A(1,1)*A(2,3)*A(3,0) - A(1,3)*A(2,1)*A(3,0) + A(1,3)*A(2,0)*A(3,1) - A(1,0)*A(2,3)*A(3,1) - A(1,1)*A(2,0)*A(3,3) + A(1,0)*A(2,1)*A(3,3);
	B(2,1) = A(0,3)*A(2,1)*A(3,0) - A(0,1)*A(2,3)*A(3,0) - A(0,3)*A(2,0)*A(3,1) + A(0,0)*A(2,3)*A(3,1) + A(0,1)*A(2,0)*A(3,3) - A(0,0)*A(2,1)*A(3,3);
	B(2,2) = A(0,1)*A(1,3)*A(3,0) - A(0,3)*A(1,1)*A(3,0) + A(0,3)*A(1,0)*A(3,1) - A(0,0)*A(1,3)*A(3,1) - A(0,1)*A(1,0)*A(3,3) + A(0,0)*A(1,1)*A(3,3);
	B(2,3) = A(0,3)*A(1,1)*A(2,0) - A(0,1)*A(1,3)*A(2,0) - A(0,3)*A(1,0)*A(2,1) + A(0,0)*A(1,3)*A(2,1) + A(0,1)*A(1,0)*A(2,3) - A(0,0)*A(1,1)*A(2,3);
	B(3,0) = A(1,2)*A(2,1)*A(3,0) - A(1,1)*A(2,2)*A(3,0) - A(1,2)*A(2,0)*A(3,1) + A(1,0)*A(2,2)*A(3,1) + A(1,1)*A(2,0)*A(3,2) - A(1,0)*A(2,1)*A(3,2);
	B(3,1) = A(0,1)*A(2,2)*A(3,0) - A(0,2)*A(2,1)*A(3,0) + A(0,2)*A(2,0)*A(3,1) - A(0,0)*A(2,2)*A(3,1) - A(0,1)*A(2,0)*A(3,2) + A(0,0)*A(2,1)*A(3,2);
	B(3,2) = A(0,2)*A(1,1)*A(3,0) - A(0,1)*A(1,2)*A(3,0) - A(0,2)*A(1,0)*A(3,1) + A(0,0)*A(1,2)*A(3,1) + A(0,1)*A(1,0)*A(3,2) - A(0,0)*A(1,1)*A(3,2);
	B(3,3) = A(0,1)*A(1,2)*A(2,0) - A(0,2)*A(1,1)*A(2,0) + A(0,2)*A(1,0)*A(2,1) - A(0,0)*A(1,2)*A(2,1) - A(0,1)*A(1,0)*A(2,2) + A(0,0)*A(1,1)*A(2,2);

	// Invertable iff the determinant is not equal to zero.
    B /= det();

    return B;
  }